

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

Scl_Item_t * Scl_LibertyReadPinTiming(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__s1;
  Scl_Item_t *pSVar5;
  Scl_Item_t *pSVar6;
  
  uVar1 = pPinOut->Child;
  iVar4 = p->nItems;
  if (iVar4 <= (int)uVar1) {
LAB_0046173f:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLiberty.c"
                  ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
    pSVar6 = p->pItems + uVar1;
    do {
      iVar3 = (pSVar6->Key).Beg;
      iVar2 = (pSVar6->Key).End - iVar3;
      iVar3 = strncmp(p->pContents + iVar3,"timing",(long)iVar2);
      if (iVar2 == 6 && iVar3 == 0) {
        uVar1 = pSVar6->Child;
        if (iVar4 <= (int)uVar1) goto LAB_0046173f;
        if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
          pSVar5 = p->pItems + uVar1;
          do {
            iVar3 = (pSVar5->Key).Beg;
            iVar2 = (pSVar5->Key).End - iVar3;
            iVar3 = strncmp(p->pContents + iVar3,"related_pin",(long)iVar2);
            if (iVar2 == 0xb && iVar3 == 0) {
              __s1 = Scl_LibertyReadString(p,pSVar5->Head);
              iVar4 = strcmp(__s1,pNameIn);
              if (iVar4 == 0) {
                return pSVar6;
              }
              iVar4 = p->nItems;
            }
            uVar1 = pSVar5->Next;
            if (iVar4 <= (int)uVar1) goto LAB_0046173f;
          } while ((-1 < (int)uVar1) && (pSVar5 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0)
                  );
        }
      }
      uVar1 = pSVar6->Next;
      if (iVar4 <= (int)uVar1) goto LAB_0046173f;
    } while ((-1 < (int)uVar1) && (pSVar6 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
  }
  return (Scl_Item_t *)0x0;
}

Assistant:

Scl_Item_t * Scl_LibertyReadPinTiming( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Scl_Item_t * pTiming, * pPinIn;
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                return pTiming;
    return NULL;
}